

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::write_exponent<char,fmt::v7::detail::buffer_appender<char>>
          (int exp,buffer_appender<char> it)

{
  undefined1 uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  if (exp + 9999U < 19999) {
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar3 = lVar2 + 1;
    if (exp < 0) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar3) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar3;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar2) = 0x2d;
      exp = -exp;
    }
    else {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar3) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar3;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar2) = 0x2b;
    }
    if (99 < (uint)exp) {
      uVar4 = (exp & 0xffffU) / 100;
      if (999 < (uint)exp) {
        uVar1 = basic_data<void>::digits[(ulong)uVar4 * 2];
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) < uVar3) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar3 = lVar2 + 1;
        }
        *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x10) = uVar3;
        *(undefined1 *)
         (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   8) + lVar2) = uVar1;
      }
      uVar1 = basic_data<void>::digits[(ulong)uVar4 * 2 + 1];
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) < uVar3) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar3;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar2) = uVar1;
      exp = exp + uVar4 * -100 & 0xffff;
    }
    uVar1 = basic_data<void>::digits[(ulong)(uint)exp * 2];
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar3 = lVar2 + 1;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar3) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = uVar3;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8) +
     lVar2) = uVar1;
    uVar1 = basic_data<void>::digits[(ulong)(uint)exp * 2 + 1];
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar3 = lVar2 + 1;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar3) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
    }
    *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = uVar3;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8) +
     lVar2) = uVar1;
    return (buffer_appender<char>)
           it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
              ,0x514,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}